

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_columns.cpp
# Opt level: O2

void __thiscall
duckdb::BaseColumnPruner::ReplaceBinding
          (BaseColumnPruner *this,ColumnBinding current_binding,ColumnBinding new_binding)

{
  long *plVar1;
  long lVar2;
  iterator iVar3;
  long *plVar4;
  key_type local_20;
  
  local_20.column_index = current_binding.column_index;
  local_20.table_index = current_binding.table_index;
  iVar3 = ::std::
          _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->column_references)._M_h,&local_20);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
      ._M_cur != (__node_type *)0x0) {
    plVar1 = *(long **)((long)iVar3.
                              super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                              ._M_cur + 0x20);
    for (plVar4 = *(long **)((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                                   ._M_cur + 0x18); plVar4 != plVar1; plVar4 = plVar4 + 1) {
      lVar2 = *plVar4;
      *(idx_t *)(lVar2 + 0x58) = new_binding.table_index;
      *(idx_t *)(lVar2 + 0x60) = new_binding.column_index;
    }
  }
  return;
}

Assistant:

void BaseColumnPruner::ReplaceBinding(ColumnBinding current_binding, ColumnBinding new_binding) {
	auto colrefs = column_references.find(current_binding);
	if (colrefs != column_references.end()) {
		for (auto &colref_p : colrefs->second.bindings) {
			auto &colref = colref_p.get();
			D_ASSERT(colref.binding == current_binding);
			colref.binding = new_binding;
		}
	}
}